

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O1

void rcg::convYCbCr422toQuadRGB(uint8_t *rgb,uint8_t *row,int i)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int j;
  long lVar7;
  bool bVar8;
  uint local_20 [2];
  int Y [2];
  
  uVar5 = 0;
  do {
    uVar6 = uVar5 | (long)(int)(i * 2 & 0xfffffff8);
    local_20[0] = (uint)row[uVar6];
    local_20[1] = (uint)row[uVar6 + 2];
    bVar1 = row[uVar6 + 1];
    bVar2 = row[uVar6 + 3];
    lVar7 = 0;
    do {
      iVar4 = local_20[lVar7] + (((uint)bVar2 * 0x5a + 0x1320 >> 6) - 0x100);
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      uVar3 = (uint8_t)iVar4;
      if (0xfe < iVar4) {
        uVar3 = 0xff;
      }
      *rgb = uVar3;
      iVar4 = local_20[lVar7] + (((uint)bVar2 * -0x2e + (uint)bVar1 * -0x16 + 0x6220 >> 6) - 0x100);
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      uVar3 = (uint8_t)iVar4;
      if (0xfe < iVar4) {
        uVar3 = 0xff;
      }
      rgb[1] = uVar3;
      iVar4 = local_20[lVar7] + (((uint)bVar1 * 0x71 + 0x7a0 >> 6) - 0x100);
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      uVar3 = (uint8_t)iVar4;
      if (0xfe < iVar4) {
        uVar3 = 0xff;
      }
      rgb[2] = uVar3;
      rgb = rgb + 3;
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    bVar8 = uVar5 == 0;
    uVar5 = uVar5 + 4;
  } while (bVar8);
  return;
}

Assistant:

void convYCbCr422toQuadRGB(uint8_t rgb[12], const uint8_t *row, int i)
{
  i=(i>>2)*8;

  for (int k=0; k<8; k+=4)
  {
    const int Y[2]={row[i+k], row[i+2+k]};
    const int Cb=static_cast<int>(row[i+1+k])-128;
    const int Cr=static_cast<int>(row[i+3+k])-128;

    // conversion of YCbCr into RGB with correct rounding
    const int rc=((90*Cr+16384+32)>>6)-256;
    const int gc=((-22*Cb-46*Cr+16384+32)>>6)-256;
    const int bc=((113*Cb+16384+32)>>6)-256;

    for (int j=0; j<2; j++)
    {
      *rgb++=clamp8(Y[j]+rc);
      *rgb++=clamp8(Y[j]+gc);
      *rgb++=clamp8(Y[j]+bc);
    }
  }
}